

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O0

void pty_special(Backend *be,SessionSpecialCode code,int arg)

{
  int local_24;
  int sig;
  Pty *pty;
  int arg_local;
  SessionSpecialCode code_local;
  Backend *be_local;
  
  if (code == SS_BRK) {
    if (-1 < *(int *)&be[-0x10c].interactor) {
      tcsendbreak(*(int *)&be[-0x10c].interactor,0);
    }
  }
  else if (code == SS_EOF) {
    if ((-1 < *(int *)&be[-0x107].interactor) &&
       (*(int *)&be[-0x107].interactor != *(int *)&be[-0x10c].interactor)) {
      *(undefined1 *)&be[-1].interactor = 1;
      pty_try_write((Pty *)(be + -0x10c));
    }
  }
  else {
    local_24 = -1;
    if (code == SS_SIGINT) {
      local_24 = 2;
    }
    if (code == SS_SIGTERM) {
      local_24 = 0xf;
    }
    if (code == SS_SIGKILL) {
      local_24 = 9;
    }
    if (code == SS_SIGQUIT) {
      local_24 = 3;
    }
    if (code == SS_SIGHUP) {
      local_24 = 1;
    }
    if (code == SS_SIGABRT) {
      local_24 = 6;
    }
    if (code == SS_SIGALRM) {
      local_24 = 0xe;
    }
    if (code == SS_SIGFPE) {
      local_24 = 8;
    }
    if (code == SS_SIGILL) {
      local_24 = 4;
    }
    if (code == SS_SIGPIPE) {
      local_24 = 0xd;
    }
    if (code == SS_SIGSEGV) {
      local_24 = 0xb;
    }
    if (code == SS_SIGUSR1) {
      local_24 = 10;
    }
    if (code == SS_SIGUSR2) {
      local_24 = 0xc;
    }
    if ((local_24 != -1) && (((ulong)be[-4].vt & 0x100000000) == 0)) {
      kill(*(__pid_t *)&be[-5].interactor,local_24);
    }
  }
  return;
}

Assistant:

static void pty_special(Backend *be, SessionSpecialCode code, int arg)
{
    Pty *pty = container_of(be, Pty, backend);

    if (code == SS_BRK) {
        if (pty->master_fd >= 0)
            tcsendbreak(pty->master_fd, 0);
        return;
    }

    if (code == SS_EOF) {
        if (pty->master_i >= 0 && pty->master_i != pty->master_fd) {
            pty->pending_eof = true;
            pty_try_write(pty);
        }
        return;
    }

    {
        int sig = -1;

        #define SIGNAL_SUB(name) if (code == SS_SIG ## name) sig = SIG ## name;
        #define SIGNAL_MAIN(name, text) SIGNAL_SUB(name)
        #define SIGNALS_LOCAL_ONLY
        #include "ssh/signal-list.h"
        #undef SIGNAL_SUB
        #undef SIGNAL_MAIN
        #undef SIGNALS_LOCAL_ONLY

        if (sig != -1) {
            if (!pty->child_dead)
                kill(pty->child_pid, sig);
            return;
        }
    }

    return;
}